

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlNodePtr xmlXPathNextAncestor(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  xmlNodePtr pxVar1;
  int iVar2;
  xmlNsPtr ns_1;
  xmlAttrPtr att;
  xmlNsPtr ns;
  xmlAttrPtr tmp;
  xmlNodePtr cur_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if ((ctxt == (xmlXPathParserContextPtr)0x0) || (ctxt->context == (xmlXPathContextPtr)0x0)) {
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  else if (cur == (xmlNodePtr)0x0) {
    if (ctxt->context->node == (xmlNodePtr)0x0) {
      ctxt_local = (xmlXPathParserContextPtr)0x0;
    }
    else {
      switch(ctxt->context->node->type) {
      case XML_ELEMENT_NODE:
      case XML_TEXT_NODE:
      case XML_CDATA_SECTION_NODE:
      case XML_ENTITY_REF_NODE:
      case XML_ENTITY_NODE:
      case XML_PI_NODE:
      case XML_COMMENT_NODE:
      case XML_NOTATION_NODE:
      case XML_DTD_NODE:
      case XML_ELEMENT_DECL:
      case XML_ATTRIBUTE_DECL:
      case XML_ENTITY_DECL:
      case XML_XINCLUDE_START:
      case XML_XINCLUDE_END:
        if (ctxt->context->node->parent == (_xmlNode *)0x0) {
          ctxt_local = (xmlXPathParserContextPtr)ctxt->context->doc;
        }
        else if ((ctxt->context->node->parent->type == XML_ELEMENT_NODE) &&
                ((*ctxt->context->node->parent->name == ' ' ||
                 (iVar2 = xmlStrEqual(ctxt->context->node->parent->name,
                                      (xmlChar *)"fake node libxslt"), iVar2 != 0)))) {
          ctxt_local = (xmlXPathParserContextPtr)0x0;
        }
        else {
          ctxt_local = (xmlXPathParserContextPtr)ctxt->context->node->parent;
        }
        break;
      case XML_ATTRIBUTE_NODE:
        ctxt_local = (xmlXPathParserContextPtr)ctxt->context->node->parent;
        break;
      case XML_DOCUMENT_NODE:
      case XML_DOCUMENT_TYPE_NODE:
      case XML_DOCUMENT_FRAG_NODE:
      case XML_HTML_DOCUMENT_NODE:
        ctxt_local = (xmlXPathParserContextPtr)0x0;
        break;
      case XML_NAMESPACE_DECL:
        pxVar1 = ctxt->context->node;
        if ((pxVar1->_private == (void *)0x0) || (*(int *)((long)pxVar1->_private + 8) == 0x12)) {
          ctxt_local = (xmlXPathParserContextPtr)0x0;
        }
        else {
          ctxt_local = (xmlXPathParserContextPtr)pxVar1->_private;
        }
        break;
      default:
        ctxt_local = (xmlXPathParserContextPtr)0x0;
      }
    }
  }
  else if (cur == ctxt->context->doc->children) {
    ctxt_local = (xmlXPathParserContextPtr)ctxt->context->doc;
  }
  else if ((xmlDocPtr)cur == ctxt->context->doc) {
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  else {
    switch(cur->type) {
    case XML_ELEMENT_NODE:
    case XML_TEXT_NODE:
    case XML_CDATA_SECTION_NODE:
    case XML_ENTITY_REF_NODE:
    case XML_ENTITY_NODE:
    case XML_PI_NODE:
    case XML_COMMENT_NODE:
    case XML_NOTATION_NODE:
    case XML_DTD_NODE:
    case XML_ELEMENT_DECL:
    case XML_ATTRIBUTE_DECL:
    case XML_ENTITY_DECL:
    case XML_XINCLUDE_START:
    case XML_XINCLUDE_END:
      if (cur->parent == (_xmlNode *)0x0) {
        ctxt_local = (xmlXPathParserContextPtr)0x0;
      }
      else if ((cur->parent->type == XML_ELEMENT_NODE) &&
              ((*cur->parent->name == ' ' ||
               (iVar2 = xmlStrEqual(cur->parent->name,(xmlChar *)"fake node libxslt"), iVar2 != 0)))
              ) {
        ctxt_local = (xmlXPathParserContextPtr)0x0;
      }
      else {
        ctxt_local = (xmlXPathParserContextPtr)cur->parent;
      }
      break;
    case XML_ATTRIBUTE_NODE:
      ctxt_local = (xmlXPathParserContextPtr)cur->parent;
      break;
    case XML_DOCUMENT_NODE:
    case XML_DOCUMENT_TYPE_NODE:
    case XML_DOCUMENT_FRAG_NODE:
    case XML_HTML_DOCUMENT_NODE:
      ctxt_local = (xmlXPathParserContextPtr)0x0;
      break;
    case XML_NAMESPACE_DECL:
      if ((cur->_private == (void *)0x0) || (*(int *)((long)cur->_private + 8) == 0x12)) {
        ctxt_local = (xmlXPathParserContextPtr)0x0;
      }
      else {
        ctxt_local = (xmlXPathParserContextPtr)cur->_private;
      }
      break;
    default:
      ctxt_local = (xmlXPathParserContextPtr)0x0;
    }
  }
  return (xmlNodePtr)ctxt_local;
}

Assistant:

xmlNodePtr
xmlXPathNextAncestor(xmlXPathParserContextPtr ctxt, xmlNodePtr cur) {
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    /*
     * the parent of an attribute or namespace node is the element
     * to which the attribute or namespace node is attached
     * !!!!!!!!!!!!!
     */
    if (cur == NULL) {
	if (ctxt->context->node == NULL) return(NULL);
	switch (ctxt->context->node->type) {
            case XML_ELEMENT_NODE:
            case XML_TEXT_NODE:
            case XML_CDATA_SECTION_NODE:
            case XML_ENTITY_REF_NODE:
            case XML_ENTITY_NODE:
            case XML_PI_NODE:
            case XML_COMMENT_NODE:
	    case XML_DTD_NODE:
	    case XML_ELEMENT_DECL:
	    case XML_ATTRIBUTE_DECL:
	    case XML_ENTITY_DECL:
            case XML_NOTATION_NODE:
	    case XML_XINCLUDE_START:
	    case XML_XINCLUDE_END:
		if (ctxt->context->node->parent == NULL)
		    return((xmlNodePtr) ctxt->context->doc);
		if ((ctxt->context->node->parent->type == XML_ELEMENT_NODE) &&
		    ((ctxt->context->node->parent->name[0] == ' ') ||
		     (xmlStrEqual(ctxt->context->node->parent->name,
				 BAD_CAST "fake node libxslt"))))
		    return(NULL);
		return(ctxt->context->node->parent);
            case XML_ATTRIBUTE_NODE: {
		xmlAttrPtr tmp = (xmlAttrPtr) ctxt->context->node;

		return(tmp->parent);
	    }
            case XML_DOCUMENT_NODE:
            case XML_DOCUMENT_TYPE_NODE:
            case XML_DOCUMENT_FRAG_NODE:
            case XML_HTML_DOCUMENT_NODE:
                return(NULL);
	    case XML_NAMESPACE_DECL: {
		xmlNsPtr ns = (xmlNsPtr) ctxt->context->node;

		if ((ns->next != NULL) &&
		    (ns->next->type != XML_NAMESPACE_DECL))
		    return((xmlNodePtr) ns->next);
		/* Bad, how did that namespace end up here ? */
                return(NULL);
	    }
	}
	return(NULL);
    }
    if (cur == ctxt->context->doc->children)
	return((xmlNodePtr) ctxt->context->doc);
    if (cur == (xmlNodePtr) ctxt->context->doc)
	return(NULL);
    switch (cur->type) {
	case XML_ELEMENT_NODE:
	case XML_TEXT_NODE:
	case XML_CDATA_SECTION_NODE:
	case XML_ENTITY_REF_NODE:
	case XML_ENTITY_NODE:
	case XML_PI_NODE:
	case XML_COMMENT_NODE:
	case XML_NOTATION_NODE:
	case XML_DTD_NODE:
        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
	case XML_XINCLUDE_START:
	case XML_XINCLUDE_END:
	    if (cur->parent == NULL)
		return(NULL);
	    if ((cur->parent->type == XML_ELEMENT_NODE) &&
		((cur->parent->name[0] == ' ') ||
		 (xmlStrEqual(cur->parent->name,
			      BAD_CAST "fake node libxslt"))))
		return(NULL);
	    return(cur->parent);
	case XML_ATTRIBUTE_NODE: {
	    xmlAttrPtr att = (xmlAttrPtr) cur;

	    return(att->parent);
	}
	case XML_NAMESPACE_DECL: {
	    xmlNsPtr ns = (xmlNsPtr) cur;

	    if ((ns->next != NULL) &&
	        (ns->next->type != XML_NAMESPACE_DECL))
	        return((xmlNodePtr) ns->next);
	    /* Bad, how did that namespace end up here ? */
            return(NULL);
	}
	case XML_DOCUMENT_NODE:
	case XML_DOCUMENT_TYPE_NODE:
	case XML_DOCUMENT_FRAG_NODE:
	case XML_HTML_DOCUMENT_NODE:
	    return(NULL);
    }
    return(NULL);
}